

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomSubset>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomSubset *subset
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  __type _Var2;
  Property *pPVar3;
  string *psVar4;
  Attribute *this;
  AttrMeta *pAVar5;
  AttrMeta *pAVar6;
  size_type sVar7;
  mapped_type *this_00;
  ostream *poVar8;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffff528;
  bool local_aa9;
  Collection *local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48 [32];
  string local_a28 [32];
  ostringstream local_a08 [8];
  ostringstream ss_w_1;
  allocator local_869;
  value_type local_868 [4];
  function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_848;
  allocator local_821;
  string local_820;
  undefined1 local_800 [8];
  function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr;
  allocator local_7c1;
  value_type local_7c0 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780 [32];
  ostringstream local_760 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  string local_5c8;
  allocator local_5a1;
  key_type local_5a0 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560 [39];
  allocator local_539;
  string local_538 [32];
  string local_518;
  ostringstream local_4f8 [8];
  ostringstream ss_e_1;
  allocator local_379;
  undefined1 local_378 [32];
  undefined1 local_358 [40];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  string local_2a8;
  ostringstream local_288 [8];
  ostringstream ss_e;
  allocator local_109;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_78 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  anon_class_1_0_00000001 ElementTypeHandler;
  string *err_local;
  string *warn_local;
  GeomSubset *subset_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_78);
  bVar1 = anon_unknown_0::ReconstructMaterialBindingProperties
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_78,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&subset->super_MaterialBinding,err);
  if (bVar1) {
    local_a70 = (Collection *)0x0;
    if (subset != (GeomSubset *)0x0) {
      local_a70 = &subset->super_Collection;
    }
    bVar1 = anon_unknown_0::ReconstructCollectionProperties
                      ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_78,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        *)properties,local_a70,warn,err,
                       (bool)(options->strict_allowedToken_check & 1));
    if (bVar1) {
      __end2 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::begin(properties);
      prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
              *)::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::end(properties);
      while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
        ret.err.field_2._8_8_ =
             ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
             ::operator*(&__end2);
        ::std::__cxx11::string::string((string *)&local_e8,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_108,"familyName",&local_109);
        psVar4 = &local_108;
        anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                  ((ParseResult *)local_c8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,&local_e8,pPVar3,psVar4,&subset->familyName);
        ::std::__cxx11::string::~string((string *)&local_108);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
        ::std::__cxx11::string::~string((string *)&local_e8);
        if ((local_c8._0_4_ == DefineOnly) || (local_c8._0_4_ == PathVector)) {
          __range2._4_4_ = 3;
        }
        else if (local_c8._0_4_ == Path) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_288);
          poVar8 = ::std::operator<<((ostream *)local_288,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xf34);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_2c9);
          fmt::format<char[11],std::__cxx11::string>
                    (&local_2a8,(fmt *)local_2c8,(string *)"familyName",(char (*) [11])&ret,psVar4);
          poVar8 = ::std::operator<<((ostream *)local_288,(string *)&local_2a8);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_2a8);
          ::std::__cxx11::string::~string(local_2c8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_2f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_1.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_2f0);
            ::std::__cxx11::string::~string((string *)local_2f0);
            ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_288);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_c8);
        if (__range2._4_4_ == 0) {
          ::std::__cxx11::string::string((string *)local_358,(string *)ret.err.field_2._8_8_);
          psVar4 = (string *)(ret.err.field_2._8_8_ + 0x20);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_378,"indices",&local_379);
          pPVar3 = (Property *)local_378;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                    ((ParseResult *)(local_358 + 0x20),(_anonymous_namespace_ *)local_78,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_358,psVar4,pPVar3,(string *)&subset->indices,in_stack_fffffffffffff528
                    );
          ::std::__cxx11::string::~string((string *)local_378);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_379);
          ::std::__cxx11::string::~string((string *)local_358);
          if ((local_358._32_4_ == 0) || (local_358._32_4_ == 2)) {
            __range2._4_4_ = 3;
          }
          else if (local_358._32_4_ == 1) {
            __range2._4_4_ = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_4f8);
            poVar8 = ::std::operator<<((ostream *)local_4f8,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xf35);
            ::std::operator<<(poVar8," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_538,"Parsing attribute `{}` failed. Error: {}",&local_539);
            fmt::format<char[8],std::__cxx11::string>
                      (&local_518,(fmt *)local_538,(string *)"indices",(char (*) [8])&ret_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar3);
            poVar8 = ::std::operator<<((ostream *)local_4f8,(string *)&local_518);
            ::std::operator<<(poVar8,"\n");
            ::std::__cxx11::string::~string((string *)&local_518);
            ::std::__cxx11::string::~string(local_538);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_539);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_560,local_580);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_560);
              ::std::__cxx11::string::~string((string *)local_560);
              ::std::__cxx11::string::~string((string *)local_580);
            }
            spec_local._7_1_ = 0;
            __range2._4_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_4f8);
          }
          anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_358 + 0x20));
          if (__range2._4_4_ != 0) goto joined_r0x002c9e92;
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ret.err.field_2._8_8_,"elementType");
          if (bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_5a0,"elementType",&local_5a1);
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_78,local_5a0);
            ::std::__cxx11::string::~string((string *)local_5a0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
            if (sVar7 == 0) {
              Property::value_type_name_abi_cxx11_
                        (&local_5c8,(Property *)(ret.err.field_2._8_8_ + 0x20));
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var2 = ::std::operator==(&local_5c8,&local_5e8);
              local_aa9 = false;
              if (_Var2) {
                bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                local_aa9 = false;
                if (bVar1) {
                  local_aa9 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
                }
              }
              ::std::__cxx11::string::~string((string *)&local_5e8);
              ::std::__cxx11::string::~string((string *)&local_5c8);
              if (local_aa9 == false) {
                fun._M_invoker =
                     (_Invoker_type)
                     Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,std::__cxx11::string>(std::__cxx11::string_const&)>
                ::
                function<tinyusdz::prim::ReconstructPrim<tinyusdz::GeomSubset>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::GeomSubset*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__0&,void>
                          ((function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,std::__cxx11::string>(std::__cxx11::string_const&)>
                            *)local_800,
                           (anon_class_1_0_00000001 *)
                           ((long)&table._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)&local_820,"elementType",&local_821);
                bVar1 = options->strict_allowedToken_check;
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function(&local_848,
                           (function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)local_800);
                in_stack_fffffffffffff528 =
                     (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                      *)err;
                bVar1 = ParseUniformEnumProperty<tinyusdz::GeomSubset::ElementType,tinyusdz::GeomSubset::ElementType>
                                  (&local_820,(bool)(bVar1 & 1),&local_848,
                                   (Attribute *)fun._M_invoker,&subset->elementType,warn,err);
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function(&local_848);
                ::std::__cxx11::string::~string((string *)&local_820);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_821);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  pAVar5 = Attribute::metas((Attribute *)fun._M_invoker);
                  pAVar6 = TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>::metas
                                     (&subset->elementType);
                  AttrMetas::operator=(pAVar6,pAVar5);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)local_868,"elementType",&local_869);
                  ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_78,local_868);
                  ::std::__cxx11::string::~string((string *)local_868);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_869);
                  __range2._4_4_ = 3;
                }
                else {
                  spec_local._7_1_ = 0;
                  __range2._4_4_ = 1;
                }
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function((function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)local_800);
                goto joined_r0x002c9e92;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_760);
              poVar8 = ::std::operator<<((ostream *)local_760,"[warn]");
              poVar8 = ::std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar8 = ::std::operator<<(poVar8,":");
              poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
              poVar8 = ::std::operator<<(poVar8,"():");
              poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xf36);
              ::std::operator<<(poVar8," ");
              poVar8 = ::std::operator<<((ostream *)local_760,"No value assigned to `");
              poVar8 = ::std::operator<<(poVar8,"elementType");
              poVar8 = ::std::operator<<(poVar8,"` token attribute. Set default token value.");
              ::std::operator<<(poVar8,"\n");
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_780,local_7a0);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_780);
                ::std::__cxx11::string::~string((string *)local_780);
                ::std::__cxx11::string::~string((string *)local_7a0);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_760);
              this = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              pAVar5 = Attribute::metas(this);
              pAVar6 = TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>::metas
                                 (&subset->elementType);
              AttrMetas::operator=(pAVar6,pAVar5);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_7c0,"elementType",&local_7c1);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_78,local_7c0);
              ::std::__cxx11::string::~string((string *)local_7c0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
            }
          }
          else {
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_78,(key_type *)ret.err.field_2._8_8_);
            if (sVar7 == 0) {
              pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
              this_00 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](&subset->props,(key_type *)ret.err.field_2._8_8_);
              Property::operator=(this_00,pPVar3);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_78,(value_type *)ret.err.field_2._8_8_);
            }
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_78,(key_type *)ret.err.field_2._8_8_);
            if (sVar7 == 0) {
              ::std::__cxx11::ostringstream::ostringstream(local_a08);
              poVar8 = ::std::operator<<((ostream *)local_a08,"[warn]");
              poVar8 = ::std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar8 = ::std::operator<<(poVar8,":");
              poVar8 = ::std::operator<<(poVar8,"ReconstructPrim");
              poVar8 = ::std::operator<<(poVar8,"():");
              poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xf38);
              ::std::operator<<(poVar8," ");
              ::std::operator+((char *)local_a28,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Unsupported/unimplemented property: ");
              poVar8 = ::std::operator<<((ostream *)local_a08,local_a28);
              ::std::operator<<(poVar8,"\n");
              ::std::__cxx11::string::~string(local_a28);
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_a48,local_a68);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_a48);
                ::std::__cxx11::string::~string((string *)local_a48);
                ::std::__cxx11::string::~string((string *)local_a68);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_a08);
            }
          }
        }
        else {
joined_r0x002c9e92:
          if (__range2._4_4_ != 3) goto LAB_002ca06a;
        }
        ::std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
        ::operator++(&__end2);
      }
      spec_local._7_1_ = 1;
    }
    else {
      spec_local._7_1_ = 0;
    }
  }
  else {
    spec_local._7_1_ = 0;
  }
LAB_002ca06a:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_78);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<GeomSubset>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomSubset *subset,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)spec;
  (void)references;

  DCOUT("GeomSubset");

  // Currently schema only allows 'face'
  auto ElementTypeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomSubset::ElementType, std::string> {
    using EnumTy = std::pair<GeomSubset::ElementType, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomSubset::ElementType::Face, "face"),
        std::make_pair(GeomSubset::ElementType::Point, "point"),
    };
    return EnumHandler<GeomSubset::ElementType>("elementType", tok,
                                                    enums);
  };

  std::set<std::string> table;

  if (!prim::ReconstructMaterialBindingProperties(table, properties, subset, err)) {
    return false;
  }

  if (!prim::ReconstructCollectionProperties(
    table, properties, subset, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "familyName", GeomSubset, subset->familyName)
    PARSE_TYPED_ATTRIBUTE(table, prop, "indices", GeomSubset, subset->indices)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "elementType", GeomSubset::ElementType, ElementTypeHandler, GeomSubset, subset->elementType, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, GeomSubset, subset->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}